

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::ListOp<tinyusdz::Token>::ClearAndMakeExplicit(ListOp<tinyusdz::Token> *this)

{
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_erase_at_end
            (&this->explicit_items,
             (this->explicit_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_erase_at_end
            (&this->added_items,
             (this->added_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_erase_at_end
            (&this->prepended_items,
             (this->prepended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_erase_at_end
            (&this->appended_items,
             (this->appended_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_erase_at_end
            (&this->deleted_items,
             (this->deleted_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_erase_at_end
            (&this->ordered_items,
             (this->ordered_items).
             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_start);
  this->is_explicit = true;
  return;
}

Assistant:

void ClearAndMakeExplicit() {
    explicit_items.clear();
    added_items.clear();
    prepended_items.clear();
    appended_items.clear();
    deleted_items.clear();
    ordered_items.clear();

    is_explicit = true;
  }